

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O3

void __thiscall
QNetworkProxyQuery::QNetworkProxyQuery
          (QNetworkProxyQuery *this,quint16 bindPort,QString *protocolTag,QueryType queryType)

{
  undefined6 in_register_00000032;
  
  (this->d).d.ptr = (QNetworkProxyQueryPrivate *)0x0;
  QSharedDataPointer<QNetworkProxyQueryPrivate>::detach(&this->d);
  QUrl::setScheme((QString *)&((this->d).d.ptr)->remote);
  QSharedDataPointer<QNetworkProxyQueryPrivate>::detach(&this->d);
  ((this->d).d.ptr)->localPort = (int)CONCAT62(in_register_00000032,bindPort);
  QSharedDataPointer<QNetworkProxyQueryPrivate>::detach(&this->d);
  ((this->d).d.ptr)->type = queryType;
  return;
}

Assistant:

QNetworkProxyQuery::QNetworkProxyQuery(quint16 bindPort, const QString &protocolTag,
                                       QueryType queryType)
{
    d->remote.setScheme(protocolTag);
    d->localPort = bindPort;
    d->type = queryType;
}